

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2s_ref.c
# Opt level: O3

int blake2s_init_key(blake2s_state *S,size_t outlen,void *key,size_t keylen)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uchar *p;
  int iVar10;
  uint8_t block [64];
  undefined1 local_78;
  undefined1 uStack_77;
  undefined2 uStack_76;
  uint auStack_74 [7];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar10 = -1;
  if ((0xffffffffffffffdf < outlen - 0x21) &&
     (0xffffffffffffffdf < keylen - 0x21 && key != (void *)0x0)) {
    local_78 = (char)outlen;
    uStack_77 = (char)keylen;
    uStack_76 = 0x101;
    auStack_74[0] = 0;
    auStack_74[1] = 0;
    auStack_74[2] = 0;
    auStack_74[3] = 0;
    auStack_74[4] = 0;
    auStack_74[5] = 0;
    auStack_74[6] = 0;
    S->buflen = 0;
    S->outlen = 0;
    S->buf[0x30] = '\0';
    S->buf[0x31] = '\0';
    S->buf[0x32] = '\0';
    S->buf[0x33] = '\0';
    S->buf[0x34] = '\0';
    S->buf[0x35] = '\0';
    S->buf[0x36] = '\0';
    S->buf[0x37] = '\0';
    S->buf[0x38] = '\0';
    S->buf[0x39] = '\0';
    S->buf[0x3a] = '\0';
    S->buf[0x3b] = '\0';
    S->buf[0x3c] = '\0';
    S->buf[0x3d] = '\0';
    S->buf[0x3e] = '\0';
    S->buf[0x3f] = '\0';
    S->buf[0x20] = '\0';
    S->buf[0x21] = '\0';
    S->buf[0x22] = '\0';
    S->buf[0x23] = '\0';
    S->buf[0x24] = '\0';
    S->buf[0x25] = '\0';
    S->buf[0x26] = '\0';
    S->buf[0x27] = '\0';
    S->buf[0x28] = '\0';
    S->buf[0x29] = '\0';
    S->buf[0x2a] = '\0';
    S->buf[0x2b] = '\0';
    S->buf[0x2c] = '\0';
    S->buf[0x2d] = '\0';
    S->buf[0x2e] = '\0';
    S->buf[0x2f] = '\0';
    S->buf[0x10] = '\0';
    S->buf[0x11] = '\0';
    S->buf[0x12] = '\0';
    S->buf[0x13] = '\0';
    S->buf[0x14] = '\0';
    S->buf[0x15] = '\0';
    S->buf[0x16] = '\0';
    S->buf[0x17] = '\0';
    S->buf[0x18] = '\0';
    S->buf[0x19] = '\0';
    S->buf[0x1a] = '\0';
    S->buf[0x1b] = '\0';
    S->buf[0x1c] = '\0';
    S->buf[0x1d] = '\0';
    S->buf[0x1e] = '\0';
    S->buf[0x1f] = '\0';
    S->buf[0] = '\0';
    S->buf[1] = '\0';
    S->buf[2] = '\0';
    S->buf[3] = '\0';
    S->buf[4] = '\0';
    S->buf[5] = '\0';
    S->buf[6] = '\0';
    S->buf[7] = '\0';
    S->buf[8] = '\0';
    S->buf[9] = '\0';
    S->buf[10] = '\0';
    S->buf[0xb] = '\0';
    S->buf[0xc] = '\0';
    S->buf[0xd] = '\0';
    S->buf[0xe] = '\0';
    S->buf[0xf] = '\0';
    S->t[0] = 0;
    S->t[1] = 0;
    S->f[0] = 0;
    S->f[1] = 0;
    *(undefined8 *)&S->last_node = 0;
    S->h[0] = 0x6a09e667;
    S->h[1] = 0xbb67ae85;
    S->h[2] = 0x3c6ef372;
    S->h[3] = 0xa54ff53a;
    S->h[4] = 0x510e527f;
    S->h[5] = 0x9b05688c;
    S->h[6] = 0x1f83d9ab;
    S->h[7] = 0x5be0cd19;
    lVar9 = 0;
    do {
      puVar1 = S->h + lVar9;
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      uVar6 = auStack_74[lVar9];
      uVar7 = auStack_74[lVar9 + 1];
      uVar8 = auStack_74[lVar9 + 2];
      puVar2 = S->h + lVar9;
      *puVar2 = *puVar1 ^ *(uint *)(&local_78 + lVar9 * 4);
      puVar2[1] = uVar3 ^ uVar6;
      puVar2[2] = uVar4 ^ uVar7;
      puVar2[3] = uVar5 ^ uVar8;
      lVar9 = lVar9 + 4;
    } while (lVar9 != 8);
    S->outlen = outlen;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    memcpy(&local_58,key,keylen);
    blake2s_update(S,&local_58,0x40);
    iVar10 = 0;
    memset(&local_58,0,0x40);
  }
  return iVar10;
}

Assistant:

int blake2s_init_key( blake2s_state *S, size_t outlen, const void *key, size_t keylen )
{
  blake2s_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2S_OUTBYTES ) ) return -1;

  if ( !key || !keylen || keylen > BLAKE2S_KEYBYTES ) return -1;

  P->digest_length = (uint8_t)outlen;
  P->key_length    = (uint8_t)keylen;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store32( &P->node_offset, 0 );
  store16( &P->xof_length, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  /* memset(P->reserved, 0, sizeof(P->reserved) ); */
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );

  if( blake2s_init_param( S, P ) < 0 ) return -1;

  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );
    blake2s_update( S, block, BLAKE2S_BLOCKBYTES );
    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}